

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

Group * __thiscall
metaf::GroupParser::reparseAlternative<11ul>
          (Group *__return_storage_ptr__,GroupParser *this,string *group,ReportPart reportPart,
          ReportMetadata *reportMetadata,size_t ignoreIndex)

{
  undefined4 in_register_0000000c;
  optional<metaf::SeaSurfaceGroup> parsed;
  _Storage<metaf::SeaSurfaceGroup,_true> local_4c;
  char local_34;
  
  if ((reportMetadata != (ReportMetadata *)0xb) &&
     (SeaSurfaceGroup::parse
                ((optional<metaf::SeaSurfaceGroup> *)&local_4c._M_value,(string *)this,
                 (ReportPart)group,(ReportMetadata *)CONCAT44(in_register_0000000c,reportPart)),
     local_34 != '\0')) {
    ((_Optional_base<unsigned_int,_true,_true> *)
    ((long)&(__return_storage_ptr__->
            super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
            ).
            super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
            .
            super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
            .
            super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
            .
            super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
            .
            super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
            ._M_u + 0x10))->_M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)
         local_4c._M_value.wh.whValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>;
    *(optional<int> *)
     &(__return_storage_ptr__->
      super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      ).
      super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      .
      super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      .
      super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      .
      super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      .
      super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
      ._M_u = local_4c._M_value.t.tempValue.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ).
             super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             .
             super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
             ._M_u + 8) = local_4c._8_8_;
    (__return_storage_ptr__->
    super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    ).
    super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    .
    super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
    ._M_index = '\v';
    return __return_storage_ptr__;
  }
  reparseAlternative<12ul>
            (__return_storage_ptr__,this,(string *)((ulong)group & 0xffffffff),reportPart,
             reportMetadata,ignoreIndex);
  return __return_storage_ptr__;
}

Assistant:

static Group reparseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata,
		size_t ignoreIndex)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			if (I != ignoreIndex) {
				const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
				if (parsed.has_value()) return *parsed;
			}
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return reparseAlternative<I+1>(group, reportPart, reportMetadata, ignoreIndex);
		}
	}